

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_slider_float(nk_context *ctx,float min_value,float *value,float max_value,
                       float value_step)

{
  float fVar1;
  nk_widget_layout_states nVar2;
  float *in_RSI;
  long in_RDI;
  float fVar3;
  nk_input *unaff_retaddr;
  nk_style_slider *in_stack_00000008;
  float in_stack_00000010;
  nk_widget_layout_states state;
  nk_rect bounds;
  float old_value;
  int ret;
  nk_style *style;
  nk_input *in;
  nk_panel *layout;
  nk_window *win;
  bool local_71;
  nk_context *in_stack_ffffffffffffffc0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  uint uVar4;
  
  if ((((in_RDI == 0) || (*(long *)(in_RDI + 0x40d8) == 0)) ||
      (*(long *)(*(long *)(in_RDI + 0x40d8) + 0xa8) == 0)) || (in_RSI == (float *)0x0)) {
    uVar4 = 0;
  }
  else {
    nVar2 = nk_widget(*(nk_rect **)(*(long *)(in_RDI + 0x40d8) + 0xa8),in_stack_ffffffffffffffc0);
    if (nVar2 == NK_WIDGET_INVALID) {
      uVar4 = 0;
    }
    else {
      fVar1 = *in_RSI;
      fVar3 = nk_do_slider(_old_value,(nk_command_buffer *)bounds._8_8_,stack0x00000034,bounds.y,
                           bounds.x,(float)state,in_stack_00000010,in_stack_00000008,unaff_retaddr,
                           (nk_user_font *)
                           CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
      *in_RSI = fVar3;
      local_71 = true;
      if (fVar1 < *in_RSI || fVar1 == *in_RSI) {
        local_71 = fVar1 < *in_RSI;
      }
      uVar4 = (uint)local_71;
    }
  }
  return uVar4;
}

Assistant:

NK_API nk_bool
nk_slider_float(struct nk_context *ctx, float min_value, float *value, float max_value,
float value_step)
{
struct nk_window *win;
struct nk_panel *layout;
struct nk_input *in;
const struct nk_style *style;

int ret = 0;
float old_value;
struct nk_rect bounds;
enum nk_widget_layout_states state;

NK_ASSERT(ctx);
NK_ASSERT(ctx->current);
NK_ASSERT(ctx->current->layout);
NK_ASSERT(value);
if (!ctx || !ctx->current || !ctx->current->layout || !value)
return ret;

win = ctx->current;
style = &ctx->style;
layout = win->layout;

state = nk_widget(&bounds, ctx);
if (!state) return ret;
in = (/*state == NK_WIDGET_ROM || */ layout->flags & NK_WINDOW_ROM) ? 0 : &ctx->input;

old_value = *value;
*value = nk_do_slider(&ctx->last_widget_state, &win->buffer, bounds, min_value,
old_value, max_value, value_step, &style->slider, in, style->font);
return (old_value > *value || old_value < *value);
}